

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O1

void __thiscall
LNodeIEStmt::LNodeIEStmt
          (LNodeIEStmt *this,shared_ptr<LNode> *condition,shared_ptr<LNode> *then_branch,
          shared_ptr<LNode> *else_branch)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  
  (this->else_branch).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->else_branch).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->then_branch).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->then_branch).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->condition).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->condition).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (condition->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (condition->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (condition->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  (condition->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->condition).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (this->condition).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->condition).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3
  ;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  peVar2 = (then_branch->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (then_branch->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (then_branch->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  (then_branch->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->then_branch).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->then_branch).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->then_branch).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  peVar2 = (else_branch->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (else_branch->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (else_branch->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  (else_branch->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->else_branch).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->else_branch).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->else_branch).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    return;
  }
  return;
}

Assistant:

LNodeIEStmt(std::shared_ptr<LNode> condition,
                std::shared_ptr<LNode> then_branch, std::shared_ptr<LNode> else_branch) {
        this->condition = std::move(condition);
        this->then_branch = std::move(then_branch);
        this->else_branch = std::move(else_branch);
    }